

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_FORM_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 1) {
    *s_out = "DW_FORM_addr";
    s_out_local._4_4_ = 0;
  }
  else if (val == 3) {
    *s_out = "DW_FORM_block2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 4) {
    *s_out = "DW_FORM_block4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 5) {
    *s_out = "DW_FORM_data2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 6) {
    *s_out = "DW_FORM_data4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 7) {
    *s_out = "DW_FORM_data8";
    s_out_local._4_4_ = 0;
  }
  else if (val == 8) {
    *s_out = "DW_FORM_string";
    s_out_local._4_4_ = 0;
  }
  else if (val == 9) {
    *s_out = "DW_FORM_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 10) {
    *s_out = "DW_FORM_block1";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb) {
    *s_out = "DW_FORM_data1";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xc) {
    *s_out = "DW_FORM_flag";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xd) {
    *s_out = "DW_FORM_sdata";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xe) {
    *s_out = "DW_FORM_strp";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xf) {
    *s_out = "DW_FORM_udata";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x10) {
    *s_out = "DW_FORM_ref_addr";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x11) {
    *s_out = "DW_FORM_ref1";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x12) {
    *s_out = "DW_FORM_ref2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x13) {
    *s_out = "DW_FORM_ref4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x14) {
    *s_out = "DW_FORM_ref8";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x15) {
    *s_out = "DW_FORM_ref_udata";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x16) {
    *s_out = "DW_FORM_indirect";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x17) {
    *s_out = "DW_FORM_sec_offset";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x18) {
    *s_out = "DW_FORM_exprloc";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x19) {
    *s_out = "DW_FORM_flag_present";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1a) {
    *s_out = "DW_FORM_strx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1b) {
    *s_out = "DW_FORM_addrx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1c) {
    *s_out = "DW_FORM_ref_sup4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1d) {
    *s_out = "DW_FORM_strp_sup";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1e) {
    *s_out = "DW_FORM_data16";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f) {
    *s_out = "DW_FORM_line_strp";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x20) {
    *s_out = "DW_FORM_ref_sig8";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x21) {
    *s_out = "DW_FORM_implicit_const";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x22) {
    *s_out = "DW_FORM_loclistx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x23) {
    *s_out = "DW_FORM_rnglistx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x24) {
    *s_out = "DW_FORM_ref_sup8";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x25) {
    *s_out = "DW_FORM_strx1";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x26) {
    *s_out = "DW_FORM_strx2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x27) {
    *s_out = "DW_FORM_strx3";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x28) {
    *s_out = "DW_FORM_strx4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x29) {
    *s_out = "DW_FORM_addrx1";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2a) {
    *s_out = "DW_FORM_addrx2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2b) {
    *s_out = "DW_FORM_addrx3";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2c) {
    *s_out = "DW_FORM_addrx4";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f01) {
    *s_out = "DW_FORM_GNU_addr_index";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f02) {
    *s_out = "DW_FORM_GNU_str_index";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f20) {
    *s_out = "DW_FORM_GNU_ref_alt";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f21) {
    *s_out = "DW_FORM_GNU_strp_alt";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2001) {
    *s_out = "DW_FORM_LLVM_addrx_offset";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_FORM_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_FORM_addr:
        *s_out = "DW_FORM_addr";
        return DW_DLV_OK;
    case DW_FORM_block2:
        *s_out = "DW_FORM_block2";
        return DW_DLV_OK;
    case DW_FORM_block4:
        *s_out = "DW_FORM_block4";
        return DW_DLV_OK;
    case DW_FORM_data2:
        *s_out = "DW_FORM_data2";
        return DW_DLV_OK;
    case DW_FORM_data4:
        *s_out = "DW_FORM_data4";
        return DW_DLV_OK;
    case DW_FORM_data8:
        *s_out = "DW_FORM_data8";
        return DW_DLV_OK;
    case DW_FORM_string:
        *s_out = "DW_FORM_string";
        return DW_DLV_OK;
    case DW_FORM_block:
        *s_out = "DW_FORM_block";
        return DW_DLV_OK;
    case DW_FORM_block1:
        *s_out = "DW_FORM_block1";
        return DW_DLV_OK;
    case DW_FORM_data1:
        *s_out = "DW_FORM_data1";
        return DW_DLV_OK;
    case DW_FORM_flag:
        *s_out = "DW_FORM_flag";
        return DW_DLV_OK;
    case DW_FORM_sdata:
        *s_out = "DW_FORM_sdata";
        return DW_DLV_OK;
    case DW_FORM_strp:
        *s_out = "DW_FORM_strp";
        return DW_DLV_OK;
    case DW_FORM_udata:
        *s_out = "DW_FORM_udata";
        return DW_DLV_OK;
    case DW_FORM_ref_addr:
        *s_out = "DW_FORM_ref_addr";
        return DW_DLV_OK;
    case DW_FORM_ref1:
        *s_out = "DW_FORM_ref1";
        return DW_DLV_OK;
    case DW_FORM_ref2:
        *s_out = "DW_FORM_ref2";
        return DW_DLV_OK;
    case DW_FORM_ref4:
        *s_out = "DW_FORM_ref4";
        return DW_DLV_OK;
    case DW_FORM_ref8:
        *s_out = "DW_FORM_ref8";
        return DW_DLV_OK;
    case DW_FORM_ref_udata:
        *s_out = "DW_FORM_ref_udata";
        return DW_DLV_OK;
    case DW_FORM_indirect:
        *s_out = "DW_FORM_indirect";
        return DW_DLV_OK;
    case DW_FORM_sec_offset:
        *s_out = "DW_FORM_sec_offset";
        return DW_DLV_OK;
    case DW_FORM_exprloc:
        *s_out = "DW_FORM_exprloc";
        return DW_DLV_OK;
    case DW_FORM_flag_present:
        *s_out = "DW_FORM_flag_present";
        return DW_DLV_OK;
    case DW_FORM_strx:
        *s_out = "DW_FORM_strx";
        return DW_DLV_OK;
    case DW_FORM_addrx:
        *s_out = "DW_FORM_addrx";
        return DW_DLV_OK;
    case DW_FORM_ref_sup4:
        *s_out = "DW_FORM_ref_sup4";
        return DW_DLV_OK;
    case DW_FORM_strp_sup:
        *s_out = "DW_FORM_strp_sup";
        return DW_DLV_OK;
    case DW_FORM_data16:
        *s_out = "DW_FORM_data16";
        return DW_DLV_OK;
    case DW_FORM_line_strp:
        *s_out = "DW_FORM_line_strp";
        return DW_DLV_OK;
    case DW_FORM_ref_sig8:
        *s_out = "DW_FORM_ref_sig8";
        return DW_DLV_OK;
    case DW_FORM_implicit_const:
        *s_out = "DW_FORM_implicit_const";
        return DW_DLV_OK;
    case DW_FORM_loclistx:
        *s_out = "DW_FORM_loclistx";
        return DW_DLV_OK;
    case DW_FORM_rnglistx:
        *s_out = "DW_FORM_rnglistx";
        return DW_DLV_OK;
    case DW_FORM_ref_sup8:
        *s_out = "DW_FORM_ref_sup8";
        return DW_DLV_OK;
    case DW_FORM_strx1:
        *s_out = "DW_FORM_strx1";
        return DW_DLV_OK;
    case DW_FORM_strx2:
        *s_out = "DW_FORM_strx2";
        return DW_DLV_OK;
    case DW_FORM_strx3:
        *s_out = "DW_FORM_strx3";
        return DW_DLV_OK;
    case DW_FORM_strx4:
        *s_out = "DW_FORM_strx4";
        return DW_DLV_OK;
    case DW_FORM_addrx1:
        *s_out = "DW_FORM_addrx1";
        return DW_DLV_OK;
    case DW_FORM_addrx2:
        *s_out = "DW_FORM_addrx2";
        return DW_DLV_OK;
    case DW_FORM_addrx3:
        *s_out = "DW_FORM_addrx3";
        return DW_DLV_OK;
    case DW_FORM_addrx4:
        *s_out = "DW_FORM_addrx4";
        return DW_DLV_OK;
    case DW_FORM_GNU_addr_index:
        *s_out = "DW_FORM_GNU_addr_index";
        return DW_DLV_OK;
    case DW_FORM_GNU_str_index:
        *s_out = "DW_FORM_GNU_str_index";
        return DW_DLV_OK;
    case DW_FORM_GNU_ref_alt:
        *s_out = "DW_FORM_GNU_ref_alt";
        return DW_DLV_OK;
    case DW_FORM_GNU_strp_alt:
        *s_out = "DW_FORM_GNU_strp_alt";
        return DW_DLV_OK;
    case DW_FORM_LLVM_addrx_offset:
        *s_out = "DW_FORM_LLVM_addrx_offset";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}